

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.cpp
# Opt level: O2

void __thiscall CExtPubKey::Encode(CExtPubKey *this,uchar *code)

{
  uint uVar1;
  long lVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  *code = this->nDepth;
  *(undefined4 *)(code + 1) = *(undefined4 *)this->vchFingerprint;
  uVar1 = this->nChild;
  *(uint *)(code + 5) =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar3 = *(undefined4 *)(this->chaincode).super_base_blob<256U>.m_data._M_elems;
  uVar4 = *(undefined4 *)((this->chaincode).super_base_blob<256U>.m_data._M_elems + 4);
  uVar5 = *(undefined4 *)((this->chaincode).super_base_blob<256U>.m_data._M_elems + 8);
  uVar6 = *(undefined4 *)((this->chaincode).super_base_blob<256U>.m_data._M_elems + 0xc);
  uVar7 = *(undefined4 *)((this->chaincode).super_base_blob<256U>.m_data._M_elems + 0x14);
  uVar8 = *(undefined4 *)((this->chaincode).super_base_blob<256U>.m_data._M_elems + 0x18);
  uVar9 = *(undefined4 *)((this->chaincode).super_base_blob<256U>.m_data._M_elems + 0x1c);
  *(undefined4 *)(code + 0x19) =
       *(undefined4 *)((this->chaincode).super_base_blob<256U>.m_data._M_elems + 0x10);
  *(undefined4 *)(code + 0x1d) = uVar7;
  *(undefined4 *)(code + 0x21) = uVar8;
  *(undefined4 *)(code + 0x25) = uVar9;
  *(undefined4 *)(code + 9) = uVar3;
  *(undefined4 *)(code + 0xd) = uVar4;
  *(undefined4 *)(code + 0x11) = uVar5;
  *(undefined4 *)(code + 0x15) = uVar6;
  if (((this->pubkey).vch[0] & 0xfe) != 2) {
    __assert_fail("pubkey.size() == CPubKey::COMPRESSED_SIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/pubkey.cpp"
                  ,0x17a,"void CExtPubKey::Encode(unsigned char *) const");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    code[0x49] = (this->pubkey).vch[0x20];
    uVar10 = *(undefined8 *)(this->pubkey).vch;
    uVar11 = *(undefined8 *)((this->pubkey).vch + 8);
    uVar12 = *(undefined8 *)((this->pubkey).vch + 0x18);
    *(undefined8 *)(code + 0x39) = *(undefined8 *)((this->pubkey).vch + 0x10);
    *(undefined8 *)(code + 0x41) = uVar12;
    *(undefined8 *)(code + 0x29) = uVar10;
    *(undefined8 *)(code + 0x31) = uVar11;
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CExtPubKey::Encode(unsigned char code[BIP32_EXTKEY_SIZE]) const {
    code[0] = nDepth;
    memcpy(code+1, vchFingerprint, 4);
    WriteBE32(code+5, nChild);
    memcpy(code+9, chaincode.begin(), 32);
    assert(pubkey.size() == CPubKey::COMPRESSED_SIZE);
    memcpy(code+41, pubkey.begin(), CPubKey::COMPRESSED_SIZE);
}